

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_to_dfa.cpp
# Opt level: O3

DFA * __thiscall
RegexToDFAConverter::convert(DFA *__return_storage_ptr__,RegexToDFAConverter *this,string *expr)

{
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  char letter;
  int iVar2;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var3;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var4;
  pointer pcVar5;
  iterator __position;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
  __comp;
  SyntaxTreeNode *this_01;
  ulong uVar7;
  mapped_type *pmVar8;
  int *piVar9;
  int *piVar10;
  _Rb_tree_node_base *p_Var11;
  int iVar12;
  pointer piVar13;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_02;
  long lVar14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  int *piVar16;
  const_iterator __cbeg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  _Hash_node_base *p_Var17;
  long lVar18;
  long lVar19;
  DFA *res;
  int it;
  vector<int,_std::allocator<int>_> next;
  int it_1;
  int curr_pos;
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  que;
  string simplified_expr;
  int local_11c;
  vector<int,_std::allocator<int>_> local_118;
  int local_100;
  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  *local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_e0;
  int *local_d8;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
  local_c8;
  int local_c0;
  int local_bc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  long local_b0;
  _Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  string local_50;
  
  simplify(&local_50,this,expr);
  local_bc = 0;
  this->leaves_count_ = 0;
  p_Var3 = &((this->follow_pos_).
             super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var4 = &((this->follow_pos_).
             super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_02 = p_Var3;
  if (p_Var4 != p_Var3) {
    do {
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != p_Var4);
    (this->follow_pos_).
    super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
  }
  pcVar5 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar5) {
    (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar5;
  }
  this_01 = expression_eval(this,&local_50,&local_bc);
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_initialize_map(&local_a8,0);
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>::
  emplace_back<std::vector<int,std::allocator<int>>>
            ((deque<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              *)&local_a8,&local_118);
  if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  p_Var17 = (this_01->first_pos)._M_h._M_before_begin._M_nxt;
  if (p_Var17 != (_Hash_node_base *)0x0) {
    do {
      local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,*(int *)&p_Var17[1]._M_nxt
                                  );
      __position._M_current =
           *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8);
      if (__position._M_current ==
          *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)
                   local_a8._M_impl.super__Deque_impl_data._M_start._M_cur,__position,
                   (int *)&local_118);
      }
      else {
        *__position._M_current = *(int *)&p_Var17[1]._M_nxt;
        *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8) =
             __position._M_current + 1;
      }
      p_Var17 = p_Var17->_M_nxt;
    } while (p_Var17 != (_Hash_node_base *)0x0);
  }
  _Var6._M_current = *(int **)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
  _Var15._M_current = *(int **)((long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 8);
  if (_Var6._M_current != _Var15._M_current) {
    uVar7 = (long)_Var15._M_current - (long)_Var6._M_current >> 2;
    lVar19 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
              (_Var6,_Var15,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                )this);
    if ((long)_Var15._M_current - (long)_Var6._M_current < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                (_Var6,_Var15,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                  )this);
    }
    else {
      __last._M_current = _Var6._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                (_Var6,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                  )this);
      for (; __last._M_current != _Var15._M_current; __last._M_current = __last._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                  (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                           )this);
      }
    }
  }
  this_00 = &this->mark_;
  std::
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::clear(&this_00->_M_t);
  __return_storage_ptr__->_vptr_DFA = (_func_int **)&PTR__DFA_00109d90;
  (__return_storage_ptr__->nodes_)._M_h._M_buckets =
       &(__return_storage_ptr__->nodes_)._M_h._M_single_bucket;
  (__return_storage_ptr__->nodes_)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->nodes_)._M_h._M_element_count = 0;
  (__return_storage_ptr__->nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_buckets =
       &(__return_storage_ptr__->final_nodes_)._M_h._M_single_bucket;
  (__return_storage_ptr__->final_nodes_)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->final_nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_element_count = 0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->final_nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->transitions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0 = this_00;
  pmVar8 = std::
           map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
           ::operator[](this_00,local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  *pmVar8 = 1;
  DFA::add_node(__return_storage_ptr__,1);
  DFA::set_initial(__return_storage_ptr__,1);
  SyntaxTreeNode::~SyntaxTreeNode(this_01);
  operator_delete(this_01);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_11c = 1;
    local_c8._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_118,local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::
      deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::pop_front((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&local_a8);
      if (0 < (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
        lVar19 = 0;
        do {
          local_e8._M_current = (int *)0x0;
          _Stack_e0._M_current = (int *)0x0;
          local_d8 = (int *)0x0;
          lVar14 = (long)(int)lVar19;
          piVar9 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar16 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar18 = lVar14;
          if ((int)lVar19 <
              (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
            do {
              pcVar5 = (this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar19 = lVar18;
              if (pcVar5[piVar16[lVar14]] != pcVar5[piVar16[lVar18]]) break;
              p_Var17 = (this->follow_pos_).
                        super__Vector_base<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar16[lVar18]]._M_h.
                        _M_before_begin._M_nxt;
              for (; p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
                local_c0 = *(int *)&p_Var17[1]._M_nxt;
                if (_Stack_e0._M_current == local_d8) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_e8,
                             (iterator)_Stack_e0._M_current,&local_c0);
                }
                else {
                  *_Stack_e0._M_current = local_c0;
                  _Stack_e0._M_current = _Stack_e0._M_current + 1;
                }
                piVar9 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                piVar16 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              lVar19 = lVar18 + 1;
              lVar18 = lVar19;
            } while (lVar19 < (int)((ulong)((long)piVar9 - (long)piVar16) >> 2));
          }
          _Var15._M_current = _Stack_e0._M_current;
          _Var6._M_current = local_e8._M_current;
          if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[piVar16[lVar14]] != '#') {
            if (local_e8._M_current != _Stack_e0._M_current) {
              uVar7 = (long)_Stack_e0._M_current - (long)local_e8._M_current >> 2;
              lVar18 = 0x3f;
              if (uVar7 != 0) {
                for (; uVar7 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_e8._M_current,_Stack_e0._M_current,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_Var6._M_current,_Var15._M_current);
            }
            __comp._M_comp.this = local_c8._M_comp.this;
            if (local_e8._M_current != _Stack_e0._M_current) {
              piVar9 = local_e8._M_current + 1;
              do {
                piVar16 = piVar9;
                if (piVar16 == _Stack_e0._M_current) goto LAB_00103857;
                piVar9 = piVar16 + 1;
              } while (piVar16[-1] != *piVar16);
              piVar10 = piVar16 + -1;
              iVar12 = piVar16[-1];
              for (; piVar9 != _Stack_e0._M_current; piVar9 = piVar9 + 1) {
                iVar2 = *piVar9;
                if (iVar12 != iVar2) {
                  piVar10[1] = iVar2;
                  piVar10 = piVar10 + 1;
                }
                iVar12 = iVar2;
              }
              if (piVar10 + 1 != _Stack_e0._M_current) {
                _Stack_e0._M_current = piVar10 + 1;
              }
            }
LAB_00103857:
            _Var6._M_current = _Stack_e0._M_current;
            local_b0 = lVar14;
            if (local_e8._M_current != _Stack_e0._M_current) {
              lVar14 = (long)_Stack_e0._M_current - (long)local_e8._M_current;
              uVar7 = lVar14 >> 2;
              lVar18 = 0x3f;
              if (uVar7 != 0) {
                for (; uVar7 >> lVar18 == 0; lVar18 = lVar18 + -1) {
                }
              }
              local_b8._M_current = local_e8._M_current;
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                        (local_e8,_Stack_e0,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e,local_c8);
              if (lVar14 < 0x41) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                          (local_b8,_Var6,__comp);
              }
              else {
                _Var15._M_current = local_b8._M_current + 0x10;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                          (local_b8,_Var15,__comp);
                for (; _Var15._M_current != _Var6._M_current;
                    _Var15._M_current = _Var15._M_current + 1) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<RegexToDFAConverter::convert(std::__cxx11::string_const&)::__0>>
                            (_Var15,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_iordachebogdan[P]RegexToDFAConverter_regex_to_dfa_cpp:24:15)>
                                     )__comp._M_comp.this);
                }
              }
            }
            pmVar8 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](local_f0,(key_type *)&local_e8);
            lVar18 = local_b0;
            if (*pmVar8 == 0) {
              pmVar8 = std::
                       map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       ::operator[](local_f0,(key_type *)&local_e8);
              local_11c = local_11c + 1;
              *pmVar8 = local_11c;
              DFA::add_node(__return_storage_ptr__,local_11c);
              std::
              deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::push_back((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&local_a8,(value_type *)&local_e8);
            }
            pmVar8 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](local_f0,&local_118);
            iVar12 = *pmVar8;
            letter = (((vector<char,_std::allocator<char>_> *)((long)local_c8._M_comp.this + 0x28))
                     ->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start
                     [local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18]];
            pmVar8 = std::
                     map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     ::operator[](local_f0,(key_type *)&local_e8);
            DFA::add_transition(__return_storage_ptr__,iVar12,letter,*pmVar8);
            this = (RegexToDFAConverter *)local_c8;
          }
          if (local_e8._M_current != (int *)0x0) {
            operator_delete(local_e8._M_current);
          }
        } while ((int)lVar19 <
                 (int)((ulong)((long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      }
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  p_Var11 = (this->mark_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->mark_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_118,(vector<int,_std::allocator<int>_> *)(p_Var11 + 1));
      local_100 = *(int *)&p_Var11[1]._M_right;
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        piVar13 = local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if ((this->what_letter_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar13] == '#') {
            DFA::add_final(__return_storage_ptr__,local_100);
            break;
          }
          piVar13 = piVar13 + 1;
        } while (piVar13 !=
                 local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_118.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  std::
  deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~deque((deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

DFA RegexToDFAConverter::convert(const string &expr) {
  string simplified_expr = simplify(expr);

  //evaluate expression
  int curr_pos = 0;
  leaves_count_ = 0, follow_pos_.clear(); what_letter_.clear();
  auto syntax_tree_root = expression_eval(simplified_expr, curr_pos);

  auto comp = [&](int a, int b) -> bool {
    return (what_letter_[a] == what_letter_[b] ? a < b : what_letter_[a] < what_letter_[b]);
  };

  //initialize queue with first_pos of all the syntax tree as a starting state
  queue< vector<int> > que;
  que.push(vector<int>());
  for (int it : syntax_tree_root->first_pos)
    que.front().push_back(it);
  sort(que.front().begin(), que.front().end(), comp);

  mark_.clear();
  int num_states = 0;
  DFA res;
  mark_[que.front()] = ++num_states;
  res.add_node(num_states);
  res.set_initial(num_states);
  delete syntax_tree_root;

  while (!que.empty()) {
    auto curr_state = que.front();
    que.pop();

    //for each state generate a next state based on follow_pos and by choosing
    //subsets of positions with same letter

    int i = 0;
    while (i < (int)curr_state.size()) {
      int j = i;
      vector< int > next;
      while (j < (int)curr_state.size() && what_letter_[curr_state[i]] == what_letter_[curr_state[j]]) {
        for (int it : follow_pos_[curr_state[j]])
          next.push_back(it);
        j++;
      }

      //ignore states generated by the end marker
      if (what_letter_[curr_state[i]] == '#') {
        i = j;
        continue;
      }
      sort(next.begin(), next.end());
      next.erase(unique(next.begin(), next.end()), next.end());
      sort(next.begin(), next.end(), comp);

      //add the new state
      if (!mark_[next]) {
        mark_[next] = ++num_states;
        res.add_node(num_states);
        que.push(next);
      }

      //and the corresponding transition
      res.add_transition(mark_[curr_state], what_letter_[curr_state[i]], mark_[next]);
      i = j;
    }
  }

  for (auto it : mark_)
    for (int state : it.first)
      if (what_letter_[state] == '#') {
        res.add_final(it.second);
        break;
      }

  return res;
}